

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::AssignmentExpression::fromComponents
          (Compilation *compilation,optional<slang::ast::BinaryOperator> op,
          bitmask<slang::ast::AssignFlags> flags,Expression *lhs,Expression *rhs,SourceRange opRange
          ,TimingControl *timingControl,SourceRange sourceRange,ASTContext *context)

{
  bool bVar1;
  AssignmentExpression *expr;
  Expression *pEVar2;
  Symbol *pSVar3;
  DiagCode code;
  ASTContext *context_00;
  SourceRange SVar4;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  SourceLocation args_6;
  bitmask<slang::ast::AssignFlags> local_42;
  bool local_41;
  TimingControl *local_40;
  _Storage<slang::ast::BinaryOperator,_true> local_38;
  bool bStack_34;
  
  args_6 = (SourceLocation)&sourceRange;
  local_41 = (bool)(flags.m_bits & 1);
  context_00 = (ASTContext *)rhs;
  local_42.m_bits = flags.m_bits;
  local_40 = timingControl;
  _local_38 = (_Optional_payload_base<slang::ast::BinaryOperator>)
              op.super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::BinaryOperator>;
  expr = BumpAllocator::
         emplace<slang::ast::AssignmentExpression,std::optional<slang::ast::BinaryOperator>&,bool,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::TimingControl_const*&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,
                    (optional<slang::ast::BinaryOperator> *)&local_38,&local_41,(lhs->type).ptr,lhs,
                    rhs,&local_40,(SourceRange *)args_6);
  bVar1 = Expression::bad(lhs);
  if ((!bVar1) && (bVar1 = Expression::bad(rhs), !bVar1)) {
    if (lhs->kind == Streaming) {
      assignmentRange.endLoc = (SourceLocation)context;
      assignmentRange.startLoc = opRange.endLoc;
      bVar1 = Bitstream::canBeTarget
                        ((Bitstream *)lhs,(StreamingConcatenationExpression *)rhs,
                         (Expression *)opRange.startLoc,assignmentRange,context_00);
      if ((bVar1) &&
         (bVar1 = Expression::requireLValue(lhs,context,opRange.startLoc,local_42,(Expression *)0x0)
         , bVar1)) {
        return &expr->super_Expression;
      }
    }
    else {
      if (bStack_34 == true) {
        pEVar2 = &BumpAllocator::
                  emplace<slang::ast::LValueReferenceExpression,slang::ast::Type_const&,slang::SourceRange&>
                            (&compilation->super_BumpAllocator,(lhs->type).ptr,&lhs->sourceRange)->
                  super_Expression;
        SVar4.endLoc = sourceRange.endLoc;
        SVar4.startLoc = sourceRange.startLoc;
        args_6 = sourceRange.endLoc;
        pEVar2 = BinaryExpression::fromComponents
                           (pEVar2,expr->right_,local_38._M_value,opRange,SVar4,context);
        expr->right_ = pEVar2;
      }
      assignmentRange_00.endLoc = (SourceLocation)&expr->left_;
      assignmentRange_00.startLoc = opRange.endLoc;
      pEVar2 = Expression::convertAssignment
                         ((Expression *)context,(ASTContext *)(lhs->type).ptr,(Type *)expr->right_,
                          (Expression *)opRange.startLoc,assignmentRange_00,(Expression **)&local_42
                          ,(bitmask<slang::ast::AssignFlags> *)args_6);
      expr->right_ = pEVar2;
      bVar1 = Expression::bad(pEVar2);
      if ((!bVar1) &&
         (bVar1 = Expression::requireLValue
                            (expr->left_,context,opRange.startLoc,local_42,(Expression *)0x0), bVar1
         )) {
        if (local_40 == (TimingControl *)0x0) {
          return &expr->super_Expression;
        }
        pSVar3 = Expression::getSymbolReference(lhs,true);
        if ((pSVar3 == (Symbol *)0x0) || (pSVar3->kind != ClockVar)) {
          if (local_40->kind != CycleDelay) {
            return &expr->super_Expression;
          }
          SVar4 = slang::syntax::SyntaxNode::sourceRange(local_40->syntax);
          code.subsystem = Expressions;
          code.code = 0x48;
        }
        else {
          if (local_40->kind == CycleDelay) {
            return &expr->super_Expression;
          }
          SVar4 = slang::syntax::SyntaxNode::sourceRange(local_40->syntax);
          code.subsystem = Expressions;
          code.code = 0x3f;
        }
        ASTContext::addDiag(context,code,SVar4);
        return &expr->super_Expression;
      }
    }
  }
  pEVar2 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar2;
}

Assistant:

Expression& AssignmentExpression::fromComponents(
    Compilation& compilation, std::optional<BinaryOperator> op, bitmask<AssignFlags> flags,
    Expression& lhs, Expression& rhs, SourceRange opRange, const TimingControl* timingControl,
    SourceRange sourceRange, const ASTContext& context) {

    auto result = compilation.emplace<AssignmentExpression>(op, flags.has(AssignFlags::NonBlocking),
                                                            *lhs.type, lhs, rhs, timingControl,
                                                            sourceRange);

    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lhs.kind == ExpressionKind::Streaming) {
        if (!Bitstream::canBeTarget(lhs.as<StreamingConcatenationExpression>(), rhs, opRange,
                                    context)) {
            return badExpr(compilation, result);
        }

        if (!lhs.requireLValue(context, opRange.start(), flags))
            return badExpr(compilation, result);

        return *result;
    }

    // If this is a compound assignment operator create a binary expression that will
    // apply the operator for us on the right hand side.
    if (op) {
        auto lvalRef = compilation.emplace<LValueReferenceExpression>(*lhs.type, lhs.sourceRange);
        result->right_ = &BinaryExpression::fromComponents(*lvalRef, *result->right_, *op, opRange,
                                                           sourceRange, context);
    }

    result->right_ = &convertAssignment(context, *lhs.type, *result->right_, opRange,
                                        &result->left_, &flags);
    if (result->right_->bad())
        return badExpr(compilation, result);

    if (!result->left_->requireLValue(context, opRange.start(), flags))
        return badExpr(compilation, result);

    if (timingControl) {
        // Cycle delays are only allowed on clock vars, and clock vars
        // cannot use any timing control other than cycle delays.
        if (auto sym = lhs.getSymbolReference(); sym && sym->kind == SymbolKind::ClockVar) {
            if (timingControl->kind != TimingControlKind::CycleDelay) {
                SLANG_ASSERT(timingControl->syntax);
                context.addDiag(diag::ClockVarBadTiming, timingControl->syntax->sourceRange());
            }
        }
        else if (timingControl->kind == TimingControlKind::CycleDelay) {
            SLANG_ASSERT(timingControl->syntax);
            context.addDiag(diag::CycleDelayNonClock, timingControl->syntax->sourceRange());
        }
    }

    return *result;
}